

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

bool __thiscall ccs::Value::asBool(Value *this)

{
  bool bVar1;
  bad_coercion *this_00;
  ostream *this_01;
  runtime_error *this_02;
  string asStack_1b8 [32];
  ostringstream msg;
  
  switch(this->which_) {
  case String:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)&msg);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
LAB_00144bbf:
      __cxa_throw(this_00,&bad_coercion::typeinfo,bad_coercion::~bad_coercion);
    }
    break;
  case Int:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)&msg);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
      goto LAB_00144bbf;
    }
    break;
  case Double:
    bVar1 = CcsContext::coerceString<bool>(&this->strVal_,(bool *)&msg);
    if (!bVar1) {
      this_00 = (bad_coercion *)__cxa_allocate_exception(0x28);
      bad_coercion::bad_coercion(this_00,&this->name_,&this->strVal_);
      goto LAB_00144bbf;
    }
    break;
  case Bool:
    msg = (ostringstream)(this->rawPrimVal_).boolVal;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    this_01 = std::operator<<((ostream *)&msg,"Bad enum value ");
    std::ostream::operator<<((ostream *)this_01,this->which_);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_02,asStack_1b8);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (bool)msg;
}

Assistant:

bool Value::asBool() const
  { return accept<bool>(Caster<bool>(*this)); }